

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pdrInv.c
# Opt level: O1

void Pdr_ManPrintProgress(Pdr_Man_t *p,int fClose,abctime Time)

{
  void *pvVar1;
  bool bVar2;
  int iVar3;
  uint uVar4;
  long lVar5;
  Vec_Vec_t *pVVar6;
  uint uVar7;
  uint uVar8;
  long lVar9;
  ulong uVar10;
  char *pcVar11;
  uint uVar12;
  Pdr_Man_t *pPVar13;
  int iVar14;
  int iVar15;
  
  if (1 < p->vSolvers->nSize) {
    iVar15 = 0;
    pPVar13 = p;
    iVar3 = Abc_FrameIsBatchMode();
    if (fClose != 0 || iVar3 == 0) {
      lVar5 = (long)p->vClauses->nSize;
      if (0 < lVar5) {
        lVar9 = 0;
        iVar15 = 0;
        do {
          uVar7 = *(uint *)((long)p->vClauses->pArray[lVar9] + 4);
          pPVar13 = (Pdr_Man_t *)(ulong)(uVar7 + 1);
          if ((1 < uVar7 + 1) && (pPVar13 = (Pdr_Man_t *)0x0, uVar7 != 0)) {
            do {
              pPVar13 = (Pdr_Man_t *)(ulong)((int)pPVar13 + 1);
              bVar2 = 9 < uVar7;
              uVar7 = uVar7 / 10;
            } while (bVar2);
          }
          iVar15 = iVar15 + (int)pPVar13 + 1;
          lVar9 = lVar9 + 1;
        } while (lVar9 != lVar5);
      }
      iVar3 = 0x3c;
      if (0x3c < iVar15) {
        iVar3 = iVar15;
      }
      Abc_Print((int)pPVar13,"%3d :",(ulong)(p->vSolvers->nSize - 1));
      iVar14 = 5;
      if (0x3c < iVar15) {
        Abc_Print((int)pPVar13," ...");
        iVar14 = 9;
      }
      pVVar6 = p->vClauses;
      if (0 < pVVar6->nSize) {
        lVar5 = 0;
        iVar15 = 0;
        do {
          pvVar1 = pVVar6->pArray[lVar5];
          uVar7 = *(uint *)((long)pvVar1 + 4);
          uVar10 = (ulong)uVar7;
          if (iVar15 < iVar3 + -0x3c) {
            uVar4 = uVar7 + 1;
            if ((1 < uVar4) && (uVar4 = 0, uVar7 != 0)) {
              do {
                uVar7 = (uint)uVar10;
                uVar4 = uVar4 + 1;
                uVar10 = uVar10 / 10;
              } while (9 < uVar7);
            }
          }
          else {
            Abc_Print((int)pPVar13," %d");
            uVar8 = *(uint *)((long)pvVar1 + 4);
            uVar7 = uVar8 + 1;
            uVar4 = uVar7;
            if ((1 < uVar7) && (uVar4 = 0, uVar12 = uVar8, uVar8 != 0)) {
              do {
                pPVar13 = (Pdr_Man_t *)((ulong)uVar12 / 10);
                uVar4 = uVar4 + 1;
                bVar2 = 9 < uVar12;
                uVar12 = uVar12 / 10;
              } while (bVar2);
            }
            if (1 < uVar7) {
              uVar7 = 0;
              uVar12 = 0;
              if (uVar8 != 0) {
                do {
                  uVar7 = uVar12 + 1;
                  bVar2 = 9 < uVar8;
                  uVar8 = uVar8 / 10;
                  uVar12 = uVar7;
                } while (bVar2);
              }
            }
            iVar14 = iVar14 + uVar7 + 1;
          }
          iVar15 = iVar15 + uVar4 + 1;
          lVar5 = lVar5 + 1;
          pVVar6 = p->vClauses;
        } while (lVar5 < pVVar6->nSize);
      }
      iVar3 = (int)pPVar13;
      if (iVar14 < 0x46) {
        iVar14 = iVar14 + -0x46;
        do {
          Abc_Print((int)pPVar13," ");
          iVar3 = (int)pPVar13;
          iVar14 = iVar14 + 1;
        } while (iVar14 != 0);
      }
      Abc_Print(iVar3,"%6d",(ulong)(uint)p->nQueMax);
      Abc_Print(iVar3,"%10.2f sec",(double)Time / 1000000.0);
      if (p->pPars->fSolveAll != 0) {
        Abc_Print(iVar3,"  CEX =%4d",(ulong)(uint)p->pPars->nFailOuts);
      }
      if (p->pPars->nTimeOutOne != 0) {
        Abc_Print(iVar3,"  T/O =%3d",(ulong)(uint)p->pPars->nDropOuts);
      }
      pcVar11 = "\r";
      if (fClose != 0) {
        pcVar11 = "\n";
      }
      Abc_Print(iVar3,"%s",pcVar11);
      if (fClose != 0) {
        p->nQueMax = 0;
      }
      fflush(_stdout);
      return;
    }
  }
  return;
}

Assistant:

ABC_NAMESPACE_IMPL_START


////////////////////////////////////////////////////////////////////////
///                        DECLARATIONS                              ///
////////////////////////////////////////////////////////////////////////

////////////////////////////////////////////////////////////////////////
///                     FUNCTION DEFINITIONS                         ///
////////////////////////////////////////////////////////////////////////

/**Function*************************************************************

  Synopsis    []

  Description []
               
  SideEffects []

  SeeAlso     []

***********************************************************************/
void Pdr_ManPrintProgress( Pdr_Man_t * p, int fClose, abctime Time )
{
    Vec_Ptr_t * vVec;
    int i, ThisSize, Length, LengthStart;
    if ( Vec_PtrSize(p->vSolvers) < 2 )
        return;
    if ( Abc_FrameIsBatchMode() && !fClose )
        return;
    // count the total length of the printout
    Length = 0;
    Vec_VecForEachLevel( p->vClauses, vVec, i )
        Length += 1 + Abc_Base10Log(Vec_PtrSize(vVec)+1);
    // determine the starting point
    LengthStart = Abc_MaxInt( 0, Length - 60 );
    Abc_Print( 1, "%3d :", Vec_PtrSize(p->vSolvers)-1 );
    ThisSize = 5;
    if ( LengthStart > 0 )
    {
        Abc_Print( 1, " ..." );
        ThisSize += 4;
    }
    Length = 0;
    Vec_VecForEachLevel( p->vClauses, vVec, i )
    {
        if ( Length < LengthStart )
        {
            Length += 1 + Abc_Base10Log(Vec_PtrSize(vVec)+1);
            continue;
        }
        Abc_Print( 1, " %d", Vec_PtrSize(vVec) );
        Length += 1 + Abc_Base10Log(Vec_PtrSize(vVec)+1);
        ThisSize += 1 + Abc_Base10Log(Vec_PtrSize(vVec)+1);
    }
    for ( i = ThisSize; i < 70; i++ )
        Abc_Print( 1, " " );
    Abc_Print( 1, "%6d", p->nQueMax );
    Abc_Print( 1, "%10.2f sec", 1.0*Time/CLOCKS_PER_SEC );
    if ( p->pPars->fSolveAll )
        Abc_Print( 1, "  CEX =%4d", p->pPars->nFailOuts );
    if ( p->pPars->nTimeOutOne )
        Abc_Print( 1, "  T/O =%3d", p->pPars->nDropOuts );
    Abc_Print( 1, "%s", fClose ? "\n":"\r" );
    if ( fClose )
        p->nQueMax = 0;
    fflush( stdout );
}